

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O0

RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          Matrix<double,__1,__1,_0,__1,__1> *matrixH,
          CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          *matrixQ,bool computeU)

{
  bool bVar1;
  Index IVar2;
  Scalar *pSVar3;
  Scalar SVar4;
  type tVar5;
  double dVar6;
  Index local_e0;
  Index im;
  Vector3s shiftInfo;
  undefined1 local_b0 [8];
  Vector3s firstHouseholderVector;
  Index il;
  Real local_88;
  double local_80;
  double *local_78;
  Scalar considerAsZero;
  Scalar norm;
  Scalar exshift;
  Index totalIter;
  Index iter;
  Index iu;
  Scalar *workspace;
  Index maxIters;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *pCStack_30;
  bool computeU_local;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *matrixQ_local;
  Matrix<double,__1,__1,_0,__1,__1> *matrixH_local;
  RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  double *local_10;
  
  maxIters._7_1_ = computeU;
  pCStack_30 = matrixQ;
  matrixQ_local =
       (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        *)matrixH;
  matrixH_local = (Matrix<double,__1,__1,_0,__1,__1> *)this;
  Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=((Matrix<double,__1,__1,_0,__1,__1> *)this,matrixH);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x30),IVar2);
  if (((maxIters._7_1_ & 1) != 0) &&
     (bVar1 = internal::
              is_same_dense<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)(this + 0x18),pCStack_30,(type *)0x0),
     !bVar1)) {
    Matrix<double,-1,-1,0,-1,-1>::operator=
              ((Matrix<double,_1,_1,0,_1,_1> *)(this + 0x18),
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)pCStack_30);
  }
  workspace = *(Scalar **)(this + 0x88);
  if (workspace == (Scalar *)0xffffffffffffffff) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)matrixQ_local);
    workspace = (Scalar *)(IVar2 * 0x28);
  }
  iu = (Index)PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::coeffRef
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x30),0
                        );
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  iter = IVar2 + -1;
  totalIter = 0;
  exshift = 0.0;
  norm = 0.0;
  SVar4 = RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeNormOfT
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  considerAsZero = SVar4;
  local_88 = GenericNumTraits<double>::epsilon();
  tVar5 = numext::abs2<double>(&local_88);
  local_80 = SVar4 * tVar5;
  il = (Index)std::numeric_limits<double>::min();
  local_10 = &local_80;
  this_local = (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&il;
  local_78 = std::max<double>(local_10,(double *)this_local);
  local_78 = (double *)*local_78;
  if ((considerAsZero != 0.0) || (NAN(considerAsZero))) {
    while (-1 < iter) {
      firstHouseholderVector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] =
           (double)RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::findSmallSubdiagEntry
                             ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,iter,
                              (Scalar *)&local_78);
      if (firstHouseholderVector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] == (double)iter) {
        pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeff
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,iter,
                            iter);
        dVar6 = *pSVar3 + norm;
        pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,iter,
                            iter);
        *pSVar3 = dVar6;
        if (0 < iter) {
          pSVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
                              iter,iter + -1);
          *pSVar3 = 0.0;
        }
        iter = iter + -1;
        totalIter = 0;
      }
      else if (firstHouseholderVector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2] == (double)(iter + -1)) {
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::splitOffTwoRows
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,iter,
                   (bool)(maxIters._7_1_ & 1),&norm);
        iter = iter + -2;
        totalIter = 0;
      }
      else {
        DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
        Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
                  ((Matrix<double,3,1,0,3,1> *)local_b0,
                   (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)(shiftInfo.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + 2));
        Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&im);
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::computeShift
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,iter,totalIter,&norm
                   ,(Vector3s *)&im);
        totalIter = totalIter + 1;
        exshift = (Scalar)((long)exshift + 1);
        if ((long)workspace < (long)exshift) break;
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::initFrancisQRStep
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
                   (Index)firstHouseholderVector.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],iter,(Vector3s *)&im,&local_e0,(Vector3s *)local_b0);
        RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::performFrancisQRStep
                  ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this,
                   (Index)firstHouseholderVector.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2],local_e0,iter,(bool)(maxIters._7_1_ & 1),
                   (Vector3s *)local_b0,(Scalar *)iu);
      }
    }
  }
  if ((long)workspace < (long)exshift) {
    *(undefined4 *)(this + 0x80) = 2;
  }
  else {
    *(undefined4 *)(this + 0x80) = 0;
  }
  this[0x84] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
  this[0x85] = (RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>>)(maxIters._7_1_ & 1);
  return (RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
}

Assistant:

RealSchur<MatrixType>& RealSchur<MatrixType>::computeFromHessenberg(const HessMatrixType& matrixH, const OrthMatrixType& matrixQ,  bool computeU)
{
  using std::abs;

  m_matT = matrixH;
  m_workspaceVector.resize(m_matT.cols());
  if(computeU && !internal::is_same_dense(m_matU,matrixQ))
    m_matU = matrixQ;
  
  Index maxIters = m_maxIters;
  if (maxIters == -1)
    maxIters = m_maxIterationsPerRow * matrixH.rows();
  Scalar* workspace = &m_workspaceVector.coeffRef(0);

  // The matrix m_matT is divided in three parts. 
  // Rows 0,...,il-1 are decoupled from the rest because m_matT(il,il-1) is zero. 
  // Rows il,...,iu is the part we are working on (the active window).
  // Rows iu+1,...,end are already brought in triangular form.
  Index iu = m_matT.cols() - 1;
  Index iter = 0;      // iteration count for current eigenvalue
  Index totalIter = 0; // iteration count for whole matrix
  Scalar exshift(0);   // sum of exceptional shifts
  Scalar norm = computeNormOfT();
  // sub-diagonal entries smaller than considerAsZero will be treated as zero.
  // We use eps^2 to enable more precision in small eigenvalues.
  Scalar considerAsZero = numext::maxi<Scalar>( norm * numext::abs2(NumTraits<Scalar>::epsilon()),
                                                (std::numeric_limits<Scalar>::min)() );

  if(norm!=Scalar(0))
  {
    while (iu >= 0)
    {
      Index il = findSmallSubdiagEntry(iu,considerAsZero);

      // Check for convergence
      if (il == iu) // One root found
      {
        m_matT.coeffRef(iu,iu) = m_matT.coeff(iu,iu) + exshift;
        if (iu > 0)
          m_matT.coeffRef(iu, iu-1) = Scalar(0);
        iu--;
        iter = 0;
      }
      else if (il == iu-1) // Two roots found
      {
        splitOffTwoRows(iu, computeU, exshift);
        iu -= 2;
        iter = 0;
      }
      else // No convergence yet
      {
        // The firstHouseholderVector vector has to be initialized to something to get rid of a silly GCC warning (-O1 -Wall -DNDEBUG )
        Vector3s firstHouseholderVector = Vector3s::Zero(), shiftInfo;
        computeShift(iu, iter, exshift, shiftInfo);
        iter = iter + 1;
        totalIter = totalIter + 1;
        if (totalIter > maxIters) break;
        Index im;
        initFrancisQRStep(il, iu, shiftInfo, im, firstHouseholderVector);
        performFrancisQRStep(il, im, iu, computeU, firstHouseholderVector, workspace);
      }
    }
  }
  if(totalIter <= maxIters)
    m_info = Success;
  else
    m_info = NoConvergence;

  m_isInitialized = true;
  m_matUisUptodate = computeU;
  return *this;
}